

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

LibraryModuleNode *
tvm::runtime::SimpleObjAllocator::Handler<tvm::runtime::LibraryModuleNode>::
New<tvm::runtime::ObjectPtr<tvm::runtime::Library>&>
          (SimpleObjAllocator *param_1,ObjectPtr<tvm::runtime::Library> *args)

{
  LibraryModuleNode *this;
  ObjectPtr<tvm::runtime::Library> local_28;
  LibraryModuleNode *local_20;
  StorageType *data;
  ObjectPtr<tvm::runtime::Library> *args_local;
  SimpleObjAllocator *param_0_local;
  
  data = (StorageType *)args;
  args_local = (ObjectPtr<tvm::runtime::Library> *)param_1;
  this = (LibraryModuleNode *)operator_new(0x70);
  (this->super_ModuleNode).import_cache_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->lib_).data_ = (Object *)0x0;
  *(undefined8 *)&(this->super_ModuleNode).import_cache_._M_h._M_rehash_policy = 0;
  (this->super_ModuleNode).import_cache_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_ModuleNode).import_cache_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_ModuleNode).import_cache_._M_h._M_element_count = 0;
  (this->super_ModuleNode).import_cache_._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->super_ModuleNode).import_cache_._M_h._M_bucket_count = 0;
  (this->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ModuleNode).super_Object.deleter_ = (FDeleter)0x0;
  (this->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ModuleNode)._vptr_ModuleNode = (_func_int **)0x0;
  (this->super_ModuleNode).super_Object.type_index_ = 0;
  (this->super_ModuleNode).super_Object.ref_counter_ = (__atomic_base<int>)0x0;
  local_20 = this;
  ObjectPtr<tvm::runtime::Library>::ObjectPtr
            (&local_28,(ObjectPtr<tvm::runtime::Library> *)&data->__align);
  LibraryModuleNode::LibraryModuleNode(this,&local_28);
  ObjectPtr<tvm::runtime::Library>::~ObjectPtr(&local_28);
  return local_20;
}

Assistant:

static T* New(SimpleObjAllocator*, Args&&... args) {
      // NOTE: the first argument is not needed for SimpleObjAllocator
      // It is reserved for special allocators that needs to recycle
      // the object to itself (e.g. in the case of object pool).
      //
      // In the case of an object pool, an allocator needs to create
      // a special chunk memory that hides reference to the allocator
      // and call allocator's release function in the deleter.

      // NOTE2: Use inplace new to allocate
      // This is used to get rid of warning when deleting a virtual
      // class with non-virtual destructor.
      // We are fine here as we captured the right deleter during construction.
      // This is also the right way to get storage type for an object pool.
      StorageType* data = new StorageType();
      new (data) T(std::forward<Args>(args)...);
      return reinterpret_cast<T*>(data);
    }